

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkMiterInt(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fComb,int nPartSize,int fImplic,int fMulti)

{
  int iVar1;
  char *pcVar2;
  Abc_Ntk_t *pNtkMiter;
  char Buffer [1000];
  int fMulti_local;
  int fImplic_local;
  int nPartSize_local;
  int fComb_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  Buffer._992_4_ = fMulti;
  Buffer._996_4_ = fImplic;
  iVar1 = Abc_NtkIsStrash(pNtk1);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x5b,"Abc_Ntk_t *Abc_NtkMiterInt(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
  }
  iVar1 = Abc_NtkIsStrash(pNtk2);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x5c,"Abc_Ntk_t *Abc_NtkMiterInt(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
  }
  pNtk1_local = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  sprintf((char *)&pNtkMiter,"%s_%s_miter",pNtk1->pName,pNtk2->pName);
  pcVar2 = Extra_UtilStrsav((char *)&pNtkMiter);
  pNtk1_local->pName = pcVar2;
  Abc_NtkMiterPrepare(pNtk1,pNtk2,pNtk1_local,fComb,nPartSize,Buffer._992_4_);
  Abc_NtkMiterAddOne(pNtk1,pNtk1_local);
  Abc_NtkMiterAddOne(pNtk2,pNtk1_local);
  Abc_NtkMiterFinalize(pNtk1,pNtk2,pNtk1_local,fComb,nPartSize,Buffer._996_4_,Buffer._992_4_);
  Abc_AigCleanup((Abc_Aig_t *)pNtk1_local->pManFunc);
  iVar1 = Abc_NtkCheck(pNtk1_local);
  if (iVar1 == 0) {
    printf("Abc_NtkMiter: The network check has failed.\n");
    Abc_NtkDelete(pNtk1_local);
    pNtk1_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk1_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterInt( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fComb, int nPartSize, int fImplic, int fMulti )
{
    char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;

    assert( Abc_NtkIsStrash(pNtk1) );
    assert( Abc_NtkIsStrash(pNtk2) );

    // start the new network
    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_%s_miter", pNtk1->pName, pNtk2->pName );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

    // perform strashing
    Abc_NtkMiterPrepare( pNtk1, pNtk2, pNtkMiter, fComb, nPartSize, fMulti );
    Abc_NtkMiterAddOne( pNtk1, pNtkMiter );
    Abc_NtkMiterAddOne( pNtk2, pNtkMiter );
    Abc_NtkMiterFinalize( pNtk1, pNtk2, pNtkMiter, fComb, nPartSize, fImplic, fMulti );
    Abc_AigCleanup((Abc_Aig_t *)pNtkMiter->pManFunc);

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkMiter ) )
    {
        printf( "Abc_NtkMiter: The network check has failed.\n" );
        Abc_NtkDelete( pNtkMiter );
        return NULL;
    }
    return pNtkMiter;
}